

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O1

bool BoundedToBoundedCast(Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  int32_t iVar1;
  int32_t iVar2;
  ConversionException *this;
  
  iVar1 = BoundedType::GetMaxValue((LogicalType *)(source + 8));
  iVar2 = BoundedType::GetMaxValue((LogicalType *)(result + 8));
  if (iVar1 <= iVar2) {
    duckdb::Vector::Reinterpret(result);
    return true;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  duckdb::ConversionException::ConversionException
            (this,(LogicalType *)(source + 8),(LogicalType *)(result + 8));
  __cxa_throw(this,&duckdb::ConversionException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static bool BoundedToBoundedCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto input_max_val = BoundedType::GetMaxValue(source.GetType());
	auto output_max_val = BoundedType::GetMaxValue(result.GetType());

	if (input_max_val <= output_max_val) {
		result.Reinterpret(source);
		return true;
	} else {
		throw ConversionException(source.GetType(), result.GetType());
	}
}